

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> parse(string *module)

{
  Module *this;
  Element *pEVar1;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> extraout_RAX;
  undefined8 *in_RSI;
  SExpressionWasmBuilder local_2d8 [8];
  SExpressionWasmBuilder builder;
  SExpressionParser local_78 [8];
  SExpressionParser parser;
  MixedArena local_58;
  uint local_28;
  
  this = (Module *)operator_new(0x348);
  memset(this,0,0x348);
  wasm::Module::Module(this);
  (module->_M_dataplus)._M_p = (pointer)this;
  (this->features).features = 0x1efff;
  wasm::SExpressionParser::SExpressionParser(local_78,(char *)*in_RSI);
  pEVar1 = (Element *)wasm::Element::operator[](local_28);
  wasm::SExpressionWasmBuilder::SExpressionWasmBuilder(local_2d8,this,pEVar1,Normal);
  wasm::SExpressionWasmBuilder::~SExpressionWasmBuilder(local_2d8);
  MixedArena::~MixedArena(&local_58);
  return (unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>)
         extraout_RAX._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Module> parse(std::string module) {
  auto wasm = std::make_unique<Module>();
  wasm->features = FeatureSet::All;
  try {
    SExpressionParser parser(&module.front());
    Element& root = *parser.root;
    SExpressionWasmBuilder builder(*wasm, *root[0], IRProfile::Normal);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    Fatal() << "error in parsing wasm text";
  }
  return wasm;
}